

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

bool TTD::NSSnapValues::CheckSnapEquivTTDDouble(double d1,double d2)

{
  BOOL BVar1;
  bool local_21;
  double d2_local;
  double d1_local;
  
  BVar1 = Js::JavascriptNumber::IsNan(d1);
  if ((BVar1 == 0) && (BVar1 = Js::JavascriptNumber::IsNan(d2), BVar1 == 0)) {
    return d1 == d2;
  }
  BVar1 = Js::JavascriptNumber::IsNan(d1);
  local_21 = false;
  if (BVar1 != 0) {
    BVar1 = Js::JavascriptNumber::IsNan(d2);
    local_21 = BVar1 != 0;
  }
  return local_21;
}

Assistant:

bool CheckSnapEquivTTDDouble(double d1, double d2)
        {
            if(Js::JavascriptNumber::IsNan(d1) || Js::JavascriptNumber::IsNan(d2))
            {
                return (Js::JavascriptNumber::IsNan(d1) && Js::JavascriptNumber::IsNan(d2));
            }
            else
            {
                return (d1 == d2);
            }
        }